

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstm.cpp
# Opt level: O1

int __thiscall ncnn::LSTM::load_model(LSTM *this,ModelBin *mb)

{
  Mat *pMVar1;
  int *piVar2;
  void *pvVar3;
  Allocator *pAVar4;
  ulong uVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  void *local_78;
  int *piStack_70;
  size_t local_68;
  int local_60;
  Allocator *local_58;
  int local_50;
  int iStack_4c;
  int iStack_48;
  int iStack_44;
  int local_40;
  size_t local_38;
  
  uVar7 = (this->direction == 2) + 1;
  uVar5 = (long)this->weight_data_size / (long)(int)uVar7;
  iVar8 = (int)((long)((ulong)(uint)((int)uVar5 >> 0x1f) << 0x20 | uVar5 & 0xffffffff) /
               (long)this->hidden_size);
  iVar6 = iVar8 + 3;
  if (-1 < iVar8) {
    iVar6 = iVar8;
  }
  (*mb->_vptr_ModelBin[4])
            (&local_78,mb,(ulong)(uint)(iVar6 >> 2),(ulong)(uint)(this->hidden_size << 2),
             (ulong)uVar7,0);
  pMVar1 = &this->weight_xc_data;
  if (pMVar1 != (Mat *)&local_78) {
    if (piStack_70 != (int *)0x0) {
      LOCK();
      *piStack_70 = *piStack_70 + 1;
      UNLOCK();
    }
    piVar2 = (this->weight_xc_data).refcount;
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        pvVar3 = (this->weight_xc_data).data;
        pAVar4 = (this->weight_xc_data).allocator;
        if (pAVar4 == (Allocator *)0x0) {
          if (pvVar3 != (void *)0x0) {
            free(pvVar3);
          }
        }
        else {
          (*pAVar4->_vptr_Allocator[3])();
        }
      }
    }
    (this->weight_xc_data).cstep = 0;
    *(undefined8 *)((long)&(this->weight_xc_data).refcount + 4) = 0;
    *(undefined8 *)((long)&(this->weight_xc_data).elemsize + 4) = 0;
    pMVar1->data = (void *)0x0;
    (this->weight_xc_data).refcount = (int *)0x0;
    (this->weight_xc_data).dims = 0;
    (this->weight_xc_data).w = 0;
    (this->weight_xc_data).h = 0;
    (this->weight_xc_data).d = 0;
    (this->weight_xc_data).c = 0;
    (this->weight_xc_data).data = local_78;
    (this->weight_xc_data).refcount = piStack_70;
    (this->weight_xc_data).elemsize = local_68;
    (this->weight_xc_data).elempack = local_60;
    (this->weight_xc_data).allocator = local_58;
    (this->weight_xc_data).dims = local_50;
    (this->weight_xc_data).w = iStack_4c;
    (this->weight_xc_data).h = iStack_48;
    (this->weight_xc_data).d = iStack_44;
    (this->weight_xc_data).c = local_40;
    (this->weight_xc_data).cstep = local_38;
  }
  if (piStack_70 != (int *)0x0) {
    LOCK();
    *piStack_70 = *piStack_70 + -1;
    UNLOCK();
    if (*piStack_70 == 0) {
      if (local_58 == (Allocator *)0x0) {
        if (local_78 != (void *)0x0) {
          free(local_78);
        }
      }
      else {
        (*local_58->_vptr_Allocator[3])();
      }
    }
  }
  iVar8 = -100;
  if ((pMVar1->data != (void *)0x0) &&
     ((long)(this->weight_xc_data).c * (this->weight_xc_data).cstep != 0)) {
    (*mb->_vptr_ModelBin[4])(&local_78,mb,(ulong)(uint)this->hidden_size,4,(ulong)uVar7,0);
    pMVar1 = &this->bias_c_data;
    if (pMVar1 != (Mat *)&local_78) {
      if (piStack_70 != (int *)0x0) {
        LOCK();
        *piStack_70 = *piStack_70 + 1;
        UNLOCK();
      }
      piVar2 = (this->bias_c_data).refcount;
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          pvVar3 = (this->bias_c_data).data;
          pAVar4 = (this->bias_c_data).allocator;
          if (pAVar4 == (Allocator *)0x0) {
            if (pvVar3 != (void *)0x0) {
              free(pvVar3);
            }
          }
          else {
            (*pAVar4->_vptr_Allocator[3])();
          }
        }
      }
      (this->bias_c_data).cstep = 0;
      *(undefined8 *)((long)&(this->bias_c_data).refcount + 4) = 0;
      *(undefined8 *)((long)&(this->bias_c_data).elemsize + 4) = 0;
      pMVar1->data = (void *)0x0;
      (this->bias_c_data).refcount = (int *)0x0;
      (this->bias_c_data).dims = 0;
      (this->bias_c_data).w = 0;
      (this->bias_c_data).h = 0;
      (this->bias_c_data).d = 0;
      (this->bias_c_data).c = 0;
      (this->bias_c_data).data = local_78;
      (this->bias_c_data).refcount = piStack_70;
      (this->bias_c_data).elemsize = local_68;
      (this->bias_c_data).elempack = local_60;
      (this->bias_c_data).allocator = local_58;
      (this->bias_c_data).dims = local_50;
      (this->bias_c_data).w = iStack_4c;
      (this->bias_c_data).h = iStack_48;
      (this->bias_c_data).d = iStack_44;
      (this->bias_c_data).c = local_40;
      (this->bias_c_data).cstep = local_38;
    }
    if (piStack_70 != (int *)0x0) {
      LOCK();
      *piStack_70 = *piStack_70 + -1;
      UNLOCK();
      if (*piStack_70 == 0) {
        if (local_58 == (Allocator *)0x0) {
          if (local_78 != (void *)0x0) {
            free(local_78);
          }
        }
        else {
          (*local_58->_vptr_Allocator[3])();
        }
      }
    }
    if ((pMVar1->data != (void *)0x0) &&
       ((long)(this->bias_c_data).c * (this->bias_c_data).cstep != 0)) {
      (*mb->_vptr_ModelBin[4])
                (&local_78,mb,(ulong)(uint)this->num_output,(ulong)(uint)(this->hidden_size << 2),
                 (ulong)uVar7,0);
      pMVar1 = &this->weight_hc_data;
      if (pMVar1 != (Mat *)&local_78) {
        if (piStack_70 != (int *)0x0) {
          LOCK();
          *piStack_70 = *piStack_70 + 1;
          UNLOCK();
        }
        piVar2 = (this->weight_hc_data).refcount;
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            pvVar3 = (this->weight_hc_data).data;
            pAVar4 = (this->weight_hc_data).allocator;
            if (pAVar4 == (Allocator *)0x0) {
              if (pvVar3 != (void *)0x0) {
                free(pvVar3);
              }
            }
            else {
              (*pAVar4->_vptr_Allocator[3])();
            }
          }
        }
        (this->weight_hc_data).cstep = 0;
        *(undefined8 *)((long)&(this->weight_hc_data).refcount + 4) = 0;
        *(undefined8 *)((long)&(this->weight_hc_data).elemsize + 4) = 0;
        pMVar1->data = (void *)0x0;
        (this->weight_hc_data).refcount = (int *)0x0;
        (this->weight_hc_data).dims = 0;
        (this->weight_hc_data).w = 0;
        (this->weight_hc_data).h = 0;
        (this->weight_hc_data).d = 0;
        (this->weight_hc_data).c = 0;
        (this->weight_hc_data).data = local_78;
        (this->weight_hc_data).refcount = piStack_70;
        (this->weight_hc_data).elemsize = local_68;
        (this->weight_hc_data).elempack = local_60;
        (this->weight_hc_data).allocator = local_58;
        (this->weight_hc_data).dims = local_50;
        (this->weight_hc_data).w = iStack_4c;
        (this->weight_hc_data).h = iStack_48;
        (this->weight_hc_data).d = iStack_44;
        (this->weight_hc_data).c = local_40;
        (this->weight_hc_data).cstep = local_38;
      }
      if (piStack_70 != (int *)0x0) {
        LOCK();
        *piStack_70 = *piStack_70 + -1;
        UNLOCK();
        if (*piStack_70 == 0) {
          if (local_58 == (Allocator *)0x0) {
            if (local_78 != (void *)0x0) {
              free(local_78);
            }
          }
          else {
            (*local_58->_vptr_Allocator[3])();
          }
        }
      }
      if ((pMVar1->data != (void *)0x0) &&
         ((long)(this->weight_hc_data).c * (this->weight_hc_data).cstep != 0)) {
        if (this->num_output != this->hidden_size) {
          (*mb->_vptr_ModelBin[4])
                    (&local_78,mb,(ulong)(uint)this->hidden_size,(ulong)(uint)this->num_output,
                     (ulong)uVar7,0);
          pMVar1 = &this->weight_hr_data;
          if (pMVar1 != (Mat *)&local_78) {
            if (piStack_70 != (int *)0x0) {
              LOCK();
              *piStack_70 = *piStack_70 + 1;
              UNLOCK();
            }
            piVar2 = (this->weight_hr_data).refcount;
            if (piVar2 != (int *)0x0) {
              LOCK();
              *piVar2 = *piVar2 + -1;
              UNLOCK();
              if (*piVar2 == 0) {
                pvVar3 = (this->weight_hr_data).data;
                pAVar4 = (this->weight_hr_data).allocator;
                if (pAVar4 == (Allocator *)0x0) {
                  if (pvVar3 != (void *)0x0) {
                    free(pvVar3);
                  }
                }
                else {
                  (*pAVar4->_vptr_Allocator[3])();
                }
              }
            }
            (this->weight_hr_data).cstep = 0;
            *(undefined8 *)((long)&(this->weight_hr_data).refcount + 4) = 0;
            *(undefined8 *)((long)&(this->weight_hr_data).elemsize + 4) = 0;
            pMVar1->data = (void *)0x0;
            (this->weight_hr_data).refcount = (int *)0x0;
            (this->weight_hr_data).dims = 0;
            (this->weight_hr_data).w = 0;
            (this->weight_hr_data).h = 0;
            (this->weight_hr_data).d = 0;
            (this->weight_hr_data).c = 0;
            (this->weight_hr_data).data = local_78;
            (this->weight_hr_data).refcount = piStack_70;
            (this->weight_hr_data).elemsize = local_68;
            (this->weight_hr_data).elempack = local_60;
            (this->weight_hr_data).allocator = local_58;
            (this->weight_hr_data).dims = local_50;
            (this->weight_hr_data).w = iStack_4c;
            (this->weight_hr_data).h = iStack_48;
            (this->weight_hr_data).d = iStack_44;
            (this->weight_hr_data).c = local_40;
            (this->weight_hr_data).cstep = local_38;
          }
          if (piStack_70 != (int *)0x0) {
            LOCK();
            *piStack_70 = *piStack_70 + -1;
            UNLOCK();
            if (*piStack_70 == 0) {
              if (local_58 == (Allocator *)0x0) {
                if (local_78 != (void *)0x0) {
                  free(local_78);
                }
              }
              else {
                (*local_58->_vptr_Allocator[3])();
              }
            }
          }
          if (pMVar1->data == (void *)0x0) {
            return -100;
          }
          if ((long)(this->weight_hr_data).c * (this->weight_hr_data).cstep == 0) {
            return -100;
          }
        }
        iVar6 = 0;
        iVar8 = 0;
        if (this->int8_scale_term != 0) {
          (*mb->_vptr_ModelBin[3])
                    (&local_78,mb,(ulong)(uint)(this->hidden_size << 2),(ulong)uVar7,1);
          if (&this->weight_xc_data_int8_scales != (Mat *)&local_78) {
            if (piStack_70 != (int *)0x0) {
              LOCK();
              *piStack_70 = *piStack_70 + 1;
              UNLOCK();
            }
            piVar2 = (this->weight_xc_data_int8_scales).refcount;
            if (piVar2 != (int *)0x0) {
              LOCK();
              *piVar2 = *piVar2 + -1;
              UNLOCK();
              if (*piVar2 == 0) {
                pvVar3 = (this->weight_xc_data_int8_scales).data;
                pAVar4 = (this->weight_xc_data_int8_scales).allocator;
                if (pAVar4 == (Allocator *)0x0) {
                  if (pvVar3 != (void *)0x0) {
                    free(pvVar3);
                  }
                }
                else {
                  (*pAVar4->_vptr_Allocator[3])();
                }
              }
            }
            (this->weight_xc_data_int8_scales).cstep = 0;
            *(undefined8 *)((long)&(this->weight_xc_data_int8_scales).refcount + 4) = 0;
            *(undefined8 *)((long)&(this->weight_xc_data_int8_scales).elemsize + 4) = 0;
            (this->weight_xc_data_int8_scales).data = (void *)0x0;
            (this->weight_xc_data_int8_scales).refcount = (int *)0x0;
            (this->weight_xc_data_int8_scales).dims = 0;
            (this->weight_xc_data_int8_scales).w = 0;
            (this->weight_xc_data_int8_scales).h = 0;
            (this->weight_xc_data_int8_scales).d = 0;
            (this->weight_xc_data_int8_scales).c = 0;
            (this->weight_xc_data_int8_scales).data = local_78;
            (this->weight_xc_data_int8_scales).refcount = piStack_70;
            (this->weight_xc_data_int8_scales).elemsize = local_68;
            (this->weight_xc_data_int8_scales).elempack = local_60;
            (this->weight_xc_data_int8_scales).allocator = local_58;
            (this->weight_xc_data_int8_scales).dims = local_50;
            (this->weight_xc_data_int8_scales).w = iStack_4c;
            (this->weight_xc_data_int8_scales).h = iStack_48;
            (this->weight_xc_data_int8_scales).d = iStack_44;
            (this->weight_xc_data_int8_scales).c = local_40;
            (this->weight_xc_data_int8_scales).cstep = local_38;
          }
          if (piStack_70 != (int *)0x0) {
            LOCK();
            *piStack_70 = *piStack_70 + -1;
            UNLOCK();
            if (*piStack_70 == 0) {
              if (local_58 == (Allocator *)0x0) {
                if (local_78 != (void *)0x0) {
                  free(local_78);
                }
              }
              else {
                (*local_58->_vptr_Allocator[3])();
              }
            }
          }
          (*mb->_vptr_ModelBin[3])
                    (&local_78,mb,(ulong)(uint)(this->hidden_size << 2),(ulong)uVar7,1);
          if (&this->weight_hc_data_int8_scales != (Mat *)&local_78) {
            if (piStack_70 != (int *)0x0) {
              LOCK();
              *piStack_70 = *piStack_70 + 1;
              UNLOCK();
            }
            piVar2 = (this->weight_hc_data_int8_scales).refcount;
            if (piVar2 != (int *)0x0) {
              LOCK();
              *piVar2 = *piVar2 + -1;
              UNLOCK();
              if (*piVar2 == 0) {
                pvVar3 = (this->weight_hc_data_int8_scales).data;
                pAVar4 = (this->weight_hc_data_int8_scales).allocator;
                if (pAVar4 == (Allocator *)0x0) {
                  if (pvVar3 != (void *)0x0) {
                    free(pvVar3);
                  }
                }
                else {
                  (*pAVar4->_vptr_Allocator[3])();
                }
              }
            }
            (this->weight_hc_data_int8_scales).cstep = 0;
            *(undefined8 *)((long)&(this->weight_hc_data_int8_scales).refcount + 4) = 0;
            *(undefined8 *)((long)&(this->weight_hc_data_int8_scales).elemsize + 4) = 0;
            (this->weight_hc_data_int8_scales).data = (void *)0x0;
            (this->weight_hc_data_int8_scales).refcount = (int *)0x0;
            (this->weight_hc_data_int8_scales).dims = 0;
            (this->weight_hc_data_int8_scales).w = 0;
            (this->weight_hc_data_int8_scales).h = 0;
            (this->weight_hc_data_int8_scales).d = 0;
            (this->weight_hc_data_int8_scales).c = 0;
            (this->weight_hc_data_int8_scales).data = local_78;
            (this->weight_hc_data_int8_scales).refcount = piStack_70;
            (this->weight_hc_data_int8_scales).elemsize = local_68;
            (this->weight_hc_data_int8_scales).elempack = local_60;
            (this->weight_hc_data_int8_scales).allocator = local_58;
            (this->weight_hc_data_int8_scales).dims = local_50;
            (this->weight_hc_data_int8_scales).w = iStack_4c;
            (this->weight_hc_data_int8_scales).h = iStack_48;
            (this->weight_hc_data_int8_scales).d = iStack_44;
            (this->weight_hc_data_int8_scales).c = local_40;
            (this->weight_hc_data_int8_scales).cstep = local_38;
          }
          iVar8 = iVar6;
          if (piStack_70 != (int *)0x0) {
            LOCK();
            *piStack_70 = *piStack_70 + -1;
            UNLOCK();
            if (*piStack_70 == 0) {
              if (local_58 == (Allocator *)0x0) {
                if (local_78 != (void *)0x0) {
                  free(local_78);
                }
              }
              else {
                (*local_58->_vptr_Allocator[3])();
              }
            }
          }
        }
      }
    }
  }
  return iVar8;
}

Assistant:

int LSTM::load_model(const ModelBin& mb)
{
    int num_directions = direction == 2 ? 2 : 1;

    int size = weight_data_size / num_directions / hidden_size / 4;

    // raw weight data
    weight_xc_data = mb.load(size, hidden_size * 4, num_directions, 0);
    if (weight_xc_data.empty())
        return -100;

    bias_c_data = mb.load(hidden_size, 4, num_directions, 0);
    if (bias_c_data.empty())
        return -100;

    weight_hc_data = mb.load(num_output, hidden_size * 4, num_directions, 0);
    if (weight_hc_data.empty())
        return -100;

    if (num_output != hidden_size)
    {
        weight_hr_data = mb.load(hidden_size, num_output, num_directions, 0);
        if (weight_hr_data.empty())
            return -100;
    }

#if NCNN_INT8
    if (int8_scale_term)
    {
        weight_xc_data_int8_scales = mb.load(hidden_size * 4, num_directions, 1);
        weight_hc_data_int8_scales = mb.load(hidden_size * 4, num_directions, 1);
    }
#endif // NCNN_INT8

    return 0;
}